

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

size_t __thiscall gpu::Context::getMaxMemAlloc(Context *this)

{
  Data *pDVar1;
  cudaContext_t pCVar2;
  string local_68;
  string local_48;
  Data *local_28;
  element_type *local_20;
  
  pDVar1 = this->data_;
  if (((pDVar1 == (Data *)0x0) &&
      (pDVar1 = (this->data_ref_).super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr, pDVar1 == (Data *)0x0)) || (pDVar1->type != TypeOpenCL)) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/context.cpp"
               ,"");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"No GPU context!","");
    raiseException(&local_48,0xeb,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pCVar2 = (cudaContext_t)0x0;
  }
  else {
    cl((Context *)&local_28);
    pCVar2 = local_28[2].cuda_context;
    if (local_20 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20);
    }
  }
  return (size_t)pCVar2;
}

Assistant:

size_t Context::getMaxMemAlloc()
{
	size_t max_mem_alloc_size = 0;

#ifdef CUDA_SUPPORT
	if (type() == gpu::Context::TypeCUDA) {
		size_t total_mem_size = 0;
		size_t free_mem_size = 0;
		CUDA_SAFE_CALL(cudaMemGetInfo(&free_mem_size, &total_mem_size));
		max_mem_alloc_size = total_mem_size / 2;
	} else
#endif
	if (type() == gpu::Context::TypeOpenCL) {
		max_mem_alloc_size = cl()->maxMemAllocSize();
	} else {
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	return max_mem_alloc_size;
}